

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewDocProp(xmlDocPtr doc,xmlChar *name,xmlChar *value)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  xmlAttrPtr cur;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x68);
    if (doc_local == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x68);
      doc_local->type = XML_ATTRIBUTE_NODE;
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
        pxVar2 = xmlStrdup(name);
        doc_local->name = (char *)pxVar2;
      }
      else {
        pxVar2 = xmlDictLookup(doc->dict,name,-1);
        doc_local->name = (char *)pxVar2;
      }
      if (((xmlChar *)doc_local->name == (xmlChar *)0x0) ||
         ((doc_local->doc = doc, value != (xmlChar *)0x0 &&
          (iVar1 = xmlNodeParseContent((xmlNodePtr)doc_local,value,-1), iVar1 < 0)))) {
        xmlFreeProp((xmlAttrPtr)doc_local);
        doc_local = (xmlDocPtr)0x0;
      }
      else if ((xmlRegisterCallbacks != 0) &&
              (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)((xmlNodePtr)doc_local);
      }
    }
  }
  return (xmlAttrPtr)doc_local;
}

Assistant:

xmlAttrPtr
xmlNewDocProp(xmlDocPtr doc, const xmlChar *name, const xmlChar *value) {
    xmlAttrPtr cur;

    if (name == NULL) {
	return(NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
	cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;
    cur->doc = doc;
    if (value != NULL) {
	if (xmlNodeParseContent((xmlNodePtr) cur, value, -1) < 0)
            goto error;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}